

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
          (BlockSingleNestedStructArrayCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  VarType local_278;
  BufferVar local_260;
  VarType local_220;
  VarType local_208;
  BufferVar local_1f0;
  VarType local_1b0;
  BufferVar local_198;
  VarType local_158;
  BufferVar local_140;
  BufferBlock *local_100;
  BufferBlock *block;
  VarType local_e0;
  VarType local_c8;
  StructType *local_b0;
  StructType *typeT;
  VarType local_90;
  VarType local_78;
  VarType local_60;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  BlockSingleNestedStructArrayCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockSingleNestedStructArrayCase_01669220;
  this->m_layoutFlags = typeS._4_4_;
  this->m_numInstances = numInstances;
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_38 = pSVar1;
  glu::VarType::VarType(&local_60,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_60);
  glu::VarType::~VarType(&local_60);
  pSVar1 = local_38;
  glu::VarType::VarType(&local_90,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_78,&local_90,4);
  glu::StructType::addMember(pSVar1,"b",&local_78);
  glu::VarType::~VarType(&local_78);
  glu::VarType::~VarType(&local_90);
  pSVar1 = local_38;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_b0 = pSVar1;
  glu::VarType::VarType(&local_c8,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_c8);
  glu::VarType::~VarType(&local_c8);
  pSVar1 = local_b0;
  glu::VarType::VarType((VarType *)&block,local_38);
  glu::VarType::VarType(&local_e0,(VarType *)&block,3);
  glu::StructType::addMember(pSVar1,"b",&local_e0);
  glu::VarType::~VarType(&local_e0);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_100 = pBVar2;
  glu::VarType::VarType(&local_158,local_38);
  BufferVar::BufferVar(&local_140,"s",&local_158,0x400);
  BufferBlock::addMember(pBVar2,&local_140);
  BufferVar::~BufferVar(&local_140);
  glu::VarType::~VarType(&local_158);
  pBVar2 = local_100;
  glu::VarType::VarType(&local_1b0,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  BufferVar::BufferVar(&local_198,"v",&local_1b0,0);
  BufferBlock::addMember(pBVar2,&local_198);
  BufferVar::~BufferVar(&local_198);
  glu::VarType::~VarType(&local_1b0);
  pBVar2 = local_100;
  glu::VarType::VarType(&local_220,local_b0);
  glu::VarType::VarType(&local_208,&local_220,2);
  BufferVar::BufferVar(&local_1f0,"t",&local_208,0x200);
  BufferBlock::addMember(pBVar2,&local_1f0);
  BufferVar::~BufferVar(&local_1f0);
  glu::VarType::~VarType(&local_208);
  glu::VarType::~VarType(&local_220);
  pBVar2 = local_100;
  glu::VarType::VarType(&local_278,TYPE_UINT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_260,"u",&local_278,0x600);
  BufferBlock::addMember(pBVar2,&local_260);
  BufferVar::~BufferVar(&local_260);
  glu::VarType::~VarType(&local_278);
  BufferBlock::setFlags(local_100,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    BufferBlock::setInstanceName(local_100,"block");
    BufferBlock::setArraySize(local_100,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

BlockSingleNestedStructArrayCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), 2), ACCESS_READ));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}